

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::switchToPage(QWizardPrivate *this,int newId,Direction direction)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QFlagsStorage<QWizard::WizardOption> QVar4;
  Int IVar5;
  QWizard *pQVar6;
  QWizardPage *pQVar7;
  QWizardPagePrivate *pQVar8;
  int in_EDX;
  int in_ESI;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *candidate;
  QAbstractButton *nextOrFinishButton;
  WizardButton nextOrCommit;
  QWizardPage *newPage;
  QWizardPage *oldPage;
  int oldId;
  QWizard *q;
  QWizardPrivate *in_stack_00000088;
  uint in_stack_ffffffffffffff88;
  WizardOption in_stack_ffffffffffffff8c;
  WizardOption other;
  QWizardPrivate *in_stack_ffffffffffffff90;
  QWizardPrivate *this_00;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QFlagsStorage<QWizard::WizardOption> in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = q_func(in_RDI);
  disableUpdates(in_stack_ffffffffffffff90);
  iVar3 = in_RDI->current;
  pQVar7 = QWizard::currentPage((QWizard *)in_stack_ffffffffffffff90);
  if ((pQVar7 != (QWizardPage *)0x0) && (QWidget::hide((QWidget *)0x7b55e1), in_EDX == 0)) {
    in_stack_fffffffffffffff4.i =
         (Int)QFlags<QWizard::WizardOption>::operator&
                        ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8c);
    bVar2 = QFlags<QWizard::WizardOption>::operator!
                      ((QFlags<QWizard::WizardOption> *)&stack0xfffffffffffffff4);
    if (bVar2) {
      (**(code **)(*(long *)&(pQVar6->super_QDialog).super_QWidget + 0x1e0))(pQVar6,iVar3);
      pQVar8 = QWizardPage::d_func((QWizardPage *)0x7b562e);
      pQVar8->initialized = false;
    }
    QList<int>::removeLast((QList<int> *)in_stack_ffffffffffffff90);
  }
  in_RDI->current = in_ESI;
  pQVar7 = QWizard::currentPage((QWizard *)in_stack_ffffffffffffff90);
  if (pQVar7 != (QWizardPage *)0x0) {
    if (in_EDX == 1) {
      pQVar8 = QWizardPage::d_func((QWizardPage *)0x7b567f);
      if ((pQVar8->initialized & 1U) == 0) {
        pQVar8 = QWizardPage::d_func((QWizardPage *)0x7b5692);
        pQVar8->initialized = true;
        (**(code **)(*(long *)&(pQVar6->super_QDialog).super_QWidget + 0x1d8))
                  (pQVar6,in_RDI->current);
      }
      QList<int>::append((QList<int> *)0x7b56cf,in_stack_ffffffffffffff8c);
    }
    QWidget::show((QWidget *)in_RDI);
  }
  iVar3 = (**(code **)(*(long *)&(pQVar6->super_QDialog).super_QWidget + 0x1d0))();
  in_RDI->canContinue = iVar3 != -1;
  uVar10 = false;
  if (pQVar7 != (QWizardPage *)0x0) {
    uVar10 = QWizardPage::isFinalPage
                       ((QWizardPage *)
                        (ulong)CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  }
  in_RDI->canFinish = (bool)uVar10;
  _q_updateButtonStates(in_stack_00000088);
  updateButtonTexts((QWizardPrivate *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  uVar9 = false;
  if (pQVar7 != (QWizardPage *)0x0) {
    uVar9 = QWizardPage::isCommitPage((QWizardPage *)in_stack_ffffffffffffff90);
  }
  other = IndependentPages;
  if ((bool)uVar9 != false) {
    other = IgnoreSubTitles;
  }
  this_00 = (QWizardPrivate *)&in_RDI->field_20;
  if ((in_RDI->canContinue & 1U) == 0) {
    other = IgnoreSubTitles|IndependentPages;
  }
  QVar4.i = (Int)QFlags<QWizard::WizardOption>::operator&
                           ((QFlags<QWizard::WizardOption> *)this_00,other);
  IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff0);
  in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & 0xffffff;
  if (IVar5 != 0) {
    bVar2 = QWidget::isEnabled((QWidget *)0x7b57fa);
    in_stack_ffffffffffffff88 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff88);
  }
  if (((char)(in_stack_ffffffffffffff88 >> 0x18) == '\0') && (pQVar7 != (QWizardPage *)0x0)) {
    iWantTheFocus((QWidget *)CONCAT17(uVar10,CONCAT16(uVar9,in_stack_ffffffffffffff98)));
  }
  QWidget::setFocus((QWidget *)0x7b5849);
  if (in_RDI->wizStyle == MacStyle) {
    QWidget::updateGeometry((QWidget *)this_00);
  }
  enableUpdates(this_00);
  updateLayout((QWizardPrivate *)CONCAT44(in_stack_fffffffffffffff4.i,QVar4.i));
  updatePalette((QWizardPrivate *)CONCAT44(other,in_stack_ffffffffffffff88));
  QWizard::currentIdChanged((QWizard *)0x7b5894,other);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::switchToPage(int newId, Direction direction)
{
    Q_Q(QWizard);

    disableUpdates();

    int oldId = current;
    if (QWizardPage *oldPage = q->currentPage()) {
        oldPage->hide();

        if (direction == Backward) {
            if (!(opts & QWizard::IndependentPages)) {
                q->cleanupPage(oldId);
                oldPage->d_func()->initialized = false;
            }
            Q_ASSERT(history.constLast() == oldId);
            history.removeLast();
            Q_ASSERT(history.constLast() == newId);
        }
    }

    current = newId;

    QWizardPage *newPage = q->currentPage();
    if (newPage) {
        if (direction == Forward) {
            if (!newPage->d_func()->initialized) {
                newPage->d_func()->initialized = true;
                q->initializePage(current);
            }
            history.append(current);
        }
        newPage->show();
    }

    canContinue = (q->nextId() != -1);
    canFinish = (newPage && newPage->isFinalPage());

    _q_updateButtonStates();
    updateButtonTexts();

    const QWizard::WizardButton nextOrCommit =
        newPage && newPage->isCommitPage() ? QWizard::CommitButton : QWizard::NextButton;
    QAbstractButton *nextOrFinishButton =
        btns[canContinue ? nextOrCommit : QWizard::FinishButton];
    QWidget *candidate = nullptr;

    /*
        If there is no default button and the Next or Finish button
        is enabled, give focus directly to it as a convenience to the
        user. This is the normal case on OS X.

        Otherwise, give the focus to the new page's first child that
        can handle it. If there is no such child, give the focus to
        Next or Finish.
    */
    if ((opts & QWizard::NoDefaultButton) && nextOrFinishButton->isEnabled()) {
        candidate = nextOrFinishButton;
    } else if (newPage) {
        candidate = iWantTheFocus(newPage);
    }
    if (!candidate)
        candidate = nextOrFinishButton;
    candidate->setFocus();

    if (wizStyle == QWizard::MacStyle)
        q->updateGeometry();

    enableUpdates();
    updateLayout();
    updatePalette();

    emit q->currentIdChanged(current);
}